

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O0

void __thiscall YM3812::YM3812(YM3812 *this,bool stereo)

{
  bool stereo_local;
  YM3812 *this_local;
  
  OPLEmul::OPLEmul(&this->super_OPLEmul);
  (this->super_OPLEmul)._vptr_OPLEmul = (_func_int **)&PTR__YM3812_009ef160;
  init_tables();
  memset(&this->Chip,0,0x17e0);
  OPL_initalize(&this->Chip);
  (this->Chip).IsStereo = stereo;
  (*(this->super_OPLEmul)._vptr_OPLEmul[2])();
  return;
}

Assistant:

YM3812(bool stereo)
	{
		init_tables();

		/* clear */
		memset(&Chip, 0, sizeof(Chip));

		/* init global tables */
		OPL_initalize(&Chip);

		Chip.IsStereo = stereo;

		Reset();
	}